

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-101.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,longdouble kappa,longdouble delta,longdouble theta,longdouble obj_amp)

{
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  long lVar1;
  row_value rVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  bool bVar7;
  rc_size rVar8;
  undefined8 extraout_RAX;
  row_iterator prVar9;
  long lVar10;
  undefined8 uVar11;
  long lVar12;
  rc_data *__first;
  rc_size rVar13;
  rc_data *__last;
  longdouble in_ST0;
  longdouble lVar14;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar15;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int local_bc;
  rc_size local_b8;
  int local_ac;
  undefined1 local_a8 [20];
  longdouble local_94;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::row_value,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
  local_88;
  solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>
  *local_80;
  __uniq_ptr_impl<baryonyx::sparse_matrix<int>::col_value,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
  local_78;
  undefined8 local_70;
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  
  local_94 = obj_amp;
  local_48 = kappa;
  local_58 = delta;
  local_68 = theta;
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  lVar15 = in_ST4;
  debug_logger<true>::log<long_double,long_double,long_double>
            ((debug_logger<true> *)this,fmt,&local_48,&local_58,&local_68);
  if ((first->current)._M_current == (last->current)._M_current) {
    uVar11._0_4_ = 0;
    uVar11._4_4_ = 0;
  }
  else {
    local_80 = this + 0x10;
    uVar11._0_4_ = 0;
    uVar11._4_4_ = 0;
    local_88._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
          )(tuple<baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
            )first;
    local_78._M_t.
    super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
    .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl =
         (tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
          )(tuple<baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
            )last;
    do {
      local_bc = (*(int **)local_88._M_t.
                           super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
                           .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>.
                           _M_head_impl)[-1];
      if (*(int *)(this + 0x88) <= local_bc) {
        push_and_compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                  ();
        __clang_call_terminate(extraout_RAX);
      }
      local_70 = uVar11;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_a8,(int)local_80);
      if (local_a8._8_8_ != local_a8._0_8_) {
        lVar10 = *(long *)(this + 0x50);
        prVar9 = (row_iterator)local_a8._8_8_;
        do {
          lVar12 = (long)prVar9->value * 0x10;
          *(longdouble *)(lVar10 + lVar12) = *(longdouble *)(lVar10 + lVar12) * local_68;
          prVar9 = prVar9 + 1;
        } while (prVar9 != (row_iterator)local_a8._0_8_);
      }
      rVar8 = solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                          *)this,(row_iterator)local_a8._8_8_,(row_iterator)local_a8._0_8_,x);
      local_b8 = rVar8;
      if (rVar8.r_size != 0) {
        lVar10 = 0;
        rVar13.r_size = 0;
        rVar13.c_size = 0;
        lVar14 = in_ST0;
        lVar3 = in_ST1;
        lVar4 = in_ST2;
        lVar5 = in_ST3;
        lVar6 = in_ST4;
        in_ST4 = lVar15;
        do {
          in_ST3 = lVar6;
          in_ST2 = lVar5;
          in_ST1 = lVar4;
          in_ST0 = lVar3;
          quadratic_cost_type<long_double>::operator()
                    (*(longdouble **)(this + 0x80),
                     (quadratic_cost_type<long_double> *)
                     (ulong)(uint)((row_iterator)
                                  (local_a8._8_8_ +
                                  (long)*(int *)(*(long *)(this + 0x68) + 0x14 + lVar10) * 8))->
                                  column,(int)x,(bit_array *)local_a8._8_8_);
          *(longdouble *)(*(long *)(this + 0x68) + lVar10) =
               *(longdouble *)(*(long *)(this + 0x68) + lVar10) + local_94 * lVar14;
          rVar13 = (rc_size)((long)rVar13 + 1);
          rVar8 = (rc_size)((ulong)local_b8 & 0xffffffff);
          lVar10 = lVar10 + 0x20;
          lVar14 = in_ST0;
          lVar3 = in_ST1;
          lVar4 = in_ST2;
          lVar5 = in_ST3;
          lVar6 = in_ST4;
          lVar15 = in_ST4;
        } while (rVar13 != rVar8);
      }
      if (1 < rVar8.r_size) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        __first = *(rc_data **)(this + 0x68);
        lVar10 = (long)rVar8.r_size;
        std::
        __introsort_loop<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar10,(int)LZCOUNT(lVar10) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar10);
        __last = __first + 1;
        lVar10 = lVar10 * 0x20 + -0x20;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar10 = lVar10 + -0x20;
        } while (lVar10 != 0);
        std::
        shuffle<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
      }
      local_ac = solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                 ::select_variables((solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                                     *)this,&local_b8,
                                    *(int *)(*(long *)(this + 0x70) + (long)local_bc * 0xc),
                                    *(int *)(*(long *)(this + 0x70) + 4 + (long)local_bc * 0xc));
      fmt_00._M_str = "constraints {}: {} <= ";
      fmt_00._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_00,&local_bc,
                 (int *)((long)local_bc * 0xc + *(long *)(this + 0x70)));
      if (0 < local_b8.r_size) {
        lVar10 = 0x14;
        lVar12 = 0;
        do {
          lVar1 = *(long *)(this + 0x68);
          fmt_01._M_str = "{} ({} {}) ";
          fmt_01._M_len = 0xb;
          debug_logger<true>::log<int,long_double,int>
                    ((debug_logger<true> *)this,fmt_01,(int *)(lVar1 + -4 + lVar10),
                     (longdouble *)(lVar1 + -0x14 + lVar10),(int *)(lVar1 + lVar10));
          lVar12 = lVar12 + 1;
          lVar10 = lVar10 + 0x20;
        } while (lVar12 < local_b8.r_size);
      }
      fmt_02._M_str = "<= {} => Selected: {}\n";
      fmt_02._M_len = 0x16;
      debug_logger<true>::log<int,int>
                ((debug_logger<true> *)this,fmt_02,
                 (int *)(*(long *)(this + 0x70) + 4 + (long)local_bc * 0xc),&local_ac);
      bVar7 = affect<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_inequalities_101coeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_true>
                          *)this,x,(row_value *)local_a8._8_8_,local_bc,local_ac,local_b8.r_size,
                         local_48,local_58);
      uVar11._1_7_ = SUB87(local_70,1);
      uVar11._0_1_ = (byte)local_70 | bVar7;
      rVar2 = *(row_value *)
               local_88._M_t.
               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
               .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl
      ;
      *(long *)local_88._M_t.
               super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::row_value[]>_>
               .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>._M_head_impl
           = (long)rVar2 + -4;
    } while ((row_value)((long)rVar2 + -4) !=
             *(row_value *)
              local_78._M_t.
              super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_std::default_delete<baryonyx::sparse_matrix<int>::col_value[]>_>
              .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::col_value_*,_false>._M_head_impl)
    ;
  }
  return (bool)((byte)uVar11 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float obj_amp)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            for (int i = 0; i != sizes.r_size; ++i)
                R[i].value +=
                  obj_amp * c((std::get<0>(it) + R[i].id)->column, x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].min, b[k].max);

            logger::log("constraints {}: {} <= ", k, b[k].min);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({} {}) ", R[i].f, R[i].value, R[i].id);

            logger::log("<= {} => Selected: {}\n", b[k].max, selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }